

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O0

int demmt_drm_ioctl_pre(uint32_t fd,uint32_t id,uint8_t dir,uint8_t nr,uint16_t size,mmt_buf *buf,
                       void *state,mmt_memory_dump *args,int argc)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  drm_nouveau_gem_new *g;
  undefined8 in_stack_fffffffffffffdb8;
  undefined4 uVar7;
  undefined8 in_stack_fffffffffffffdc0;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffffdc8;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffdd0;
  undefined4 uVar10;
  undefined8 in_stack_fffffffffffffdd8;
  undefined4 uVar11;
  undefined8 in_stack_fffffffffffffde0;
  undefined4 uVar12;
  undefined8 in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffffe00;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe20;
  char *local_128;
  char *local_108;
  drm_gem_flink *data_18;
  drm_auth *data_17;
  drm_mode_card_res *data_16;
  drm_set_version *data_15;
  drm_get_cap *data_14;
  drm_gem_open *data_13;
  drm_gem_close *data_12;
  drm_nouveau_gem_info *data_11;
  drm_nouveau_gem_cpu_fini *data_10;
  drm_nouveau_gem_cpu_prep *data_9;
  drm_nouveau_gem_pushbuf *data_8;
  drm_nouveau_gem_new *data_7;
  drm_nouveau_gpuobj_free *data_6;
  drm_nouveau_notifierobj_alloc *data_5;
  drm_nouveau_grobj_alloc *data_4;
  drm_nouveau_channel_free *data_3;
  drm_nouveau_channel_alloc *data_2;
  drm_nouveau_setparam *data_1;
  drm_nouveau_getparam *data;
  void *ioctl_data;
  mmt_buf *buf_local;
  uint16_t size_local;
  uint8_t nr_local;
  uint8_t dir_local;
  uint32_t id_local;
  uint32_t fd_local;
  
  g = (drm_nouveau_gem_new *)(buf + 1);
  if (id != 0xc0106440) {
    if (id == 0x40106441) {
      if (dump_decoded_ioctl_data != 0) {
        if (indent_logs == 0) {
          uVar3._0_4_ = (g->info).handle;
          uVar3._4_4_ = (g->info).domain;
          if (uVar3 < 0xe) {
            local_128 = nouveau_param_names[*(long *)&g->info];
          }
          else {
            local_128 = "???";
          }
          uVar4._0_4_ = (g->info).handle;
          uVar4._4_4_ = (g->info).domain;
          fprintf(_stdout,"LOG: %sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx\n",
                  colors->rname,colors->reset,local_128,uVar4,*(undefined8 *)(buf + 3));
        }
        else {
          uVar1._0_4_ = (g->info).handle;
          uVar1._4_4_ = (g->info).domain;
          if (uVar1 < 0xe) {
            local_108 = nouveau_param_names[*(long *)&g->info];
          }
          else {
            local_108 = "???";
          }
          uVar2._0_4_ = (g->info).handle;
          uVar2._4_4_ = (g->info).domain;
          fprintf(_stdout,"%64s%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%lx), value: 0x%lx\n"," ",
                  colors->rname,colors->reset,local_108,uVar2,*(undefined8 *)(buf + 3));
        }
        if (mmt_sync_fd != -1) {
          fflush(_stdout);
        }
      }
    }
    else {
      uVar7 = (undefined4)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      if (id == 0xc0586442) {
        if (dump_decoded_ioctl_data != 0) {
          if (indent_logs == 0) {
            fprintf(_stdout,
                    "LOG: %sDRM_NOUVEAU_CHANNEL_ALLOC%s pre,  fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x\n",
                    colors->rname,colors->reset,(ulong)(g->info).handle,(ulong)buf[2].len);
          }
          else {
            fprintf(_stdout,
                    "%64s%sDRM_NOUVEAU_CHANNEL_ALLOC%s pre,  fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x\n",
                    " ",colors->rname,colors->reset,(ulong)(g->info).handle,
                    CONCAT44(uVar7,buf[2].len));
          }
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
      }
      else if (id == 0x40046443) {
        if (dump_decoded_ioctl_data != 0) {
          if (indent_logs == 0) {
            fprintf(_stdout,"LOG: %sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d\n",colors->rname,
                    colors->reset,(ulong)(g->info).handle);
          }
          else {
            fprintf(_stdout,"%64s%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d\n"," ",colors->rname,
                    colors->reset,(ulong)(g->info).handle);
          }
          if (mmt_sync_fd != -1) {
            fflush(_stdout);
          }
        }
      }
      else {
        uVar11 = (undefined4)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
        uVar10 = (undefined4)((ulong)in_stack_fffffffffffffdd0 >> 0x20);
        uVar8 = (undefined4)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
        if (id == 0x400c6444) {
          if (dump_decoded_ioctl_data != 0) {
            if (indent_logs == 0) {
              fprintf(_stdout,
                      "LOG: %sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s\n"
                      ,colors->rname,colors->reset,(ulong)(g->info).handle,colors->num,
                      CONCAT44(uVar7,buf[2].len),colors->reset,colors->eval,
                      CONCAT44(uVar10,buf[3].len),colors->reset);
            }
            else {
              fprintf(_stdout,
                      "%64s%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s\n"
                      ," ",colors->rname,colors->reset,(ulong)(g->info).handle,colors->num,
                      CONCAT44(uVar8,buf[2].len),colors->reset,colors->eval,
                      CONCAT44(uVar11,buf[3].len),colors->reset);
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
        }
        else if (id == 0xc0106445) {
          if (dump_decoded_ioctl_data != 0) {
            if (indent_logs == 0) {
              fprintf(_stdout,
                      "LOG: %sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s pre,  channel: %d, handle: 0x%0x, size: %d\n"
                      ,colors->rname,colors->reset,(ulong)(g->info).handle,(ulong)buf[2].len,
                      CONCAT44(uVar7,buf[3].len));
            }
            else {
              fprintf(_stdout,
                      "%64s%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s pre,  channel: %d, handle: 0x%0x, size: %d\n"
                      ," ",colors->rname,colors->reset,(ulong)(g->info).handle,
                      CONCAT44(uVar7,buf[2].len),CONCAT44(uVar8,buf[3].len));
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
        }
        else if (id == 0x40086446) {
          if (dump_decoded_ioctl_data != 0) {
            if (indent_logs == 0) {
              fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x\n",
                      colors->rname,colors->reset,(ulong)(g->info).handle,(ulong)buf[2].len);
            }
            else {
              fprintf(_stdout,"%64s%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x\n"," ",
                      colors->rname,colors->reset,(ulong)(g->info).handle,CONCAT44(uVar7,buf[2].len)
                     );
            }
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
        }
        else if (id == 0xc0306480) {
          if (dump_decoded_ioctl_data != 0) {
            if (indent_logs == 0) {
              fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_NEW%s pre,  ",colors->rname,colors->reset,
                      state);
            }
            else {
              fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_NEW%s pre,  "," ",colors->rname,colors->reset);
            }
            dump_drm_nouveau_gem_new(g);
            fprintf(_stdout,"\n");
            if (mmt_sync_fd != -1) {
              fflush(_stdout);
            }
          }
        }
        else {
          uVar12 = (undefined4)((ulong)in_stack_fffffffffffffde0 >> 0x20);
          uVar14 = (undefined4)((ulong)in_stack_fffffffffffffe00 >> 0x20);
          uVar13 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
          if (id == 0xc0406481) {
            if (dump_decoded_ioctl_data != 0) {
              if (indent_logs == 0) {
                fprintf(_stdout,
                        "LOG: %sDRM_NOUVEAU_GEM_PUSHBUF%s pre,  channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu\n"
                        ,colors->rname,colors->reset,(ulong)(g->info).handle,colors->num,
                        CONCAT44(uVar7,buf[2].len),colors->reset,*(undefined8 *)(buf + 3),
                        colors->num,CONCAT44(uVar11,buf[5].len),colors->reset,
                        *(undefined8 *)(buf + 7),colors->num,CONCAT44(uVar13,buf[6].len),
                        colors->reset,*(undefined8 *)(buf + 9),
                        CONCAT44((int)((ulong)in_stack_fffffffffffffe10 >> 0x20),buf[0xb].len),
                        buf[0xc].len,*(undefined8 *)(buf + 0xd),*(undefined8 *)(buf + 0xf));
              }
              else {
                fprintf(_stdout,
                        "%64s%sDRM_NOUVEAU_GEM_PUSHBUF%s pre,  channel: %d, nr_buffers: %s%d%s, buffers: 0x%lx, nr_relocs: %s%d%s, relocs: 0x%lx, nr_push: %s%d%s, push: 0x%lx, suffix0: 0x%x, suffix1: 0x%x, vram_available: %lu, gart_available: %lu\n"
                        ," ",colors->rname,colors->reset,(ulong)(g->info).handle,colors->num,
                        CONCAT44(uVar8,buf[2].len),colors->reset,*(undefined8 *)(buf + 3),
                        colors->num,CONCAT44(uVar12,buf[5].len),colors->reset,
                        *(undefined8 *)(buf + 7),colors->num,CONCAT44(uVar14,buf[6].len),
                        colors->reset,*(undefined8 *)(buf + 9),buf[0xb].len,
                        CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),buf[0xc].len),
                        *(undefined8 *)(buf + 0xd),*(undefined8 *)(buf + 0xf));
              }
              if (mmt_sync_fd != -1) {
                fflush(_stdout);
              }
            }
          }
          else {
            uVar9 = (undefined4)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
            if (id == 0x40086482) {
              if (dump_decoded_ioctl_data != 0) {
                if (indent_logs == 0) {
                  fprintf(_stdout,
                          "LOG: %sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %s%3d%s, flags: %s0x%0x%s\n",
                          colors->rname,colors->reset,colors->num,(ulong)(g->info).handle,
                          colors->reset,colors->eval,CONCAT44(uVar9,buf[2].len),colors->reset);
                }
                else {
                  fprintf(_stdout,
                          "%64s%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %s%3d%s, flags: %s0x%0x%s\n",
                          " ",colors->rname,colors->reset,colors->num,
                          CONCAT44(uVar7,(g->info).handle),colors->reset,colors->eval,
                          CONCAT44(uVar10,buf[2].len),colors->reset);
                }
                if (mmt_sync_fd != -1) {
                  fflush(_stdout);
                }
              }
            }
            else if (id == 0x40046483) {
              if (dump_decoded_ioctl_data != 0) {
                if (indent_logs == 0) {
                  fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d\n",colors->rname,
                          colors->reset,(ulong)(g->info).handle);
                }
                else {
                  fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d\n"," ",colors->rname
                          ,colors->reset,(ulong)(g->info).handle);
                }
                if (mmt_sync_fd != -1) {
                  fflush(_stdout);
                }
              }
            }
            else if (id == 0xc0286484) {
              if (dump_decoded_ioctl_data != 0) {
                if (indent_logs == 0) {
                  fprintf(_stdout,"LOG: %sDRM_NOUVEAU_GEM_INFO%s pre,  handle: %s%3d%s\n",
                          colors->rname,colors->reset,colors->num,(ulong)(g->info).handle,
                          colors->reset);
                }
                else {
                  fprintf(_stdout,"%64s%sDRM_NOUVEAU_GEM_INFO%s pre,  handle: %s%3d%s\n"," ",
                          colors->rname,colors->reset,colors->num,CONCAT44(uVar7,(g->info).handle),
                          colors->reset);
                }
                if (mmt_sync_fd != -1) {
                  fflush(_stdout);
                }
              }
            }
            else if (((id != 0xc0406400) && (id != 0xc0246400)) && (id != 0x80046402)) {
              if (id == 0x40086409) {
                if (dump_decoded_ioctl_data != 0) {
                  if (indent_logs == 0) {
                    fprintf(_stdout,"LOG: %sDRM_IOCTL_GEM_CLOSE%s, handle: %s%3d%s\n",colors->rname,
                            colors->reset,colors->num,(ulong)(g->info).handle,colors->reset);
                  }
                  else {
                    fprintf(_stdout,"%64s%sDRM_IOCTL_GEM_CLOSE%s, handle: %s%3d%s\n"," ",
                            colors->rname,colors->reset,colors->num,CONCAT44(uVar7,(g->info).handle)
                            ,colors->reset);
                  }
                  if (mmt_sync_fd != -1) {
                    fflush(_stdout);
                  }
                }
              }
              else if (id == 0xc010640b) {
                if (dump_decoded_ioctl_data != 0) {
                  if (indent_logs == 0) {
                    fprintf(_stdout,"LOG: %sDRM_IOCTL_GEM_OPEN%s pre,  name: %s%d%s\n",colors->rname
                            ,colors->reset,colors->eval,(ulong)(g->info).handle,colors->reset);
                  }
                  else {
                    fprintf(_stdout,"%64s%sDRM_IOCTL_GEM_OPEN%s pre,  name: %s%d%s\n"," ",
                            colors->rname,colors->reset,colors->eval,
                            CONCAT44(uVar7,(g->info).handle),colors->reset);
                  }
                  if (mmt_sync_fd != -1) {
                    fflush(_stdout);
                  }
                }
              }
              else if (id != 0xc010640c) {
                if (id == 0xc0106407) {
                  if (dump_decoded_ioctl_data != 0) {
                    if (indent_logs == 0) {
                      fprintf(_stdout,
                              "LOG: %sDRM_IOCTL_SET_VERSION%s pre,  di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
                              ,colors->rname,colors->reset,(ulong)(g->info).handle,(ulong)buf[2].len
                              ,CONCAT44(uVar7,buf[3].len),CONCAT44(uVar8,buf[4].len));
                    }
                    else {
                      fprintf(_stdout,
                              "%64s%sDRM_IOCTL_SET_VERSION%s pre,  di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n"
                              ," ",colors->rname,colors->reset,(ulong)(g->info).handle,
                              CONCAT44(uVar7,buf[2].len),CONCAT44(uVar8,buf[3].len),
                              CONCAT44(uVar9,buf[4].len));
                    }
                    if (mmt_sync_fd != -1) {
                      fflush(_stdout);
                    }
                  }
                }
                else if (id == 0xc04064a0) {
                  if (dump_decoded_ioctl_data != 0) {
                    uVar7 = (undefined4)((ulong)in_stack_fffffffffffffde8 >> 0x20);
                    uVar8 = (undefined4)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
                    if (indent_logs == 0) {
                      uVar6._0_4_ = (g->info).handle;
                      uVar6._4_4_ = (g->info).domain;
                      fprintf(_stdout,
                              "LOG: %sDRM_IOCTL_MODE_GETRESOURCES%s pre,  fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                              ,colors->rname,colors->reset,uVar6,*(undefined8 *)(buf + 3),
                              *(undefined8 *)(buf + 5),*(undefined8 *)(buf + 7),
                              CONCAT44(uVar9,buf[9].len),CONCAT44(uVar10,buf[10].len),
                              CONCAT44(uVar11,buf[0xb].len),CONCAT44(uVar12,buf[0xc].len),
                              CONCAT44(uVar7,buf[0xd].len),CONCAT44(uVar8,buf[0xe].len),
                              CONCAT44(uVar13,buf[0xf].len),CONCAT44(uVar14,buf[0x10].len));
                    }
                    else {
                      uVar5._0_4_ = (g->info).handle;
                      uVar5._4_4_ = (g->info).domain;
                      fprintf(_stdout,
                              "%64s%sDRM_IOCTL_MODE_GETRESOURCES%s pre,  fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n"
                              ," ",colors->rname,colors->reset,uVar5,*(undefined8 *)(buf + 3),
                              *(undefined8 *)(buf + 5),*(undefined8 *)(buf + 7),
                              CONCAT44(uVar10,buf[9].len),CONCAT44(uVar11,buf[10].len),
                              CONCAT44(uVar12,buf[0xb].len),CONCAT44(uVar7,buf[0xc].len),
                              CONCAT44(uVar8,buf[0xd].len),CONCAT44(uVar13,buf[0xe].len),
                              CONCAT44(uVar14,buf[0xf].len),
                              CONCAT44((int)((ulong)in_stack_fffffffffffffe08 >> 0x20),buf[0x10].len
                                      ));
                    }
                    if (mmt_sync_fd != -1) {
                      fflush(_stdout);
                    }
                  }
                }
                else if (((id != 0x641e) && (id != 0x641f)) &&
                        ((id != 0x40046411 && (id != 0xc008640a)))) {
                  if (indent_logs == 0) {
                    fprintf(_stdout,"LOG: %sunknown drm ioctl%s %x\n",colors->err,colors->reset,
                            (ulong)nr);
                  }
                  else {
                    fprintf(_stdout,"%64s%sunknown drm ioctl%s %x\n"," ",colors->err,colors->reset,
                            (ulong)nr);
                  }
                  if (mmt_sync_fd != -1) {
                    fflush(_stdout);
                  }
                  return 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

int demmt_drm_ioctl_pre(uint32_t fd, uint32_t id, uint8_t dir, uint8_t nr, uint16_t size,
		struct mmt_buf *buf, void *state, struct mmt_memory_dump *args, int argc)
{
	void *ioctl_data = buf->data;

	if (id == DRM_NOUVEAU_IOCTL_GETPARAM)
	{
		struct drm_nouveau_getparam *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_NOUVEAU_GETPARAM%s, param: %s%14s%s (0x%" PRIx64 ")\n",
					colors->rname, colors->reset, colors->eval,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					colors->reset, data->param);
	}
	else if (id == DRM_NOUVEAU_IOCTL_SETPARAM)
	{
		struct drm_nouveau_setparam *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_SETPARAM%s, param: %s (0x%" PRIx64 "), value: 0x%" PRIx64 "\n",
					colors->rname, colors->reset,
					data->param < ARRAY_SIZE(nouveau_param_names) ? nouveau_param_names[data->param] : "???",
					data->param, data->value);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_ALLOC)
	{
		struct drm_nouveau_channel_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_CHANNEL_ALLOC%s pre,  fb_ctxdma: 0x%0x, tt_ctxdma: 0x%0x\n",
					colors->rname, colors->reset, data->fb_ctxdma_handle, data->tt_ctxdma_handle);
	}
	else if (id == DRM_NOUVEAU_IOCTL_CHANNEL_FREE)
	{
		struct drm_nouveau_channel_free *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_CHANNEL_FREE%s, channel: %d\n", colors->rname,
					colors->reset, data->channel);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GROBJ_ALLOC)
	{
		struct drm_nouveau_grobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GROBJ_ALLOC%s, channel: %d, handle: %s0x%x%s, class: %s0x%x%s\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->handle, colors->reset, colors->eval, data->class, colors->reset);
	}
	else if (id == DRM_NOUVEAU_IOCTL_NOTIFIEROBJ_ALLOC)
	{
		struct drm_nouveau_notifierobj_alloc *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_NOTIFIEROBJ_ALLOC%s pre,  channel: %d, handle: 0x%0x, size: %d\n",
					colors->rname, colors->reset, data->channel, data->handle, data->size);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GPUOBJ_FREE)
	{
		struct drm_nouveau_gpuobj_free *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GPUOBJ_FREE%s, channel: %d, handle: 0x%0x\n",
					colors->rname, colors->reset, data->channel, data->handle);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_NEW)
	{
		struct drm_nouveau_gem_new *data = ioctl_data;

		if (dump_decoded_ioctl_data)
		{
			mmt_log("%sDRM_NOUVEAU_GEM_NEW%s pre,  ", colors->rname, colors->reset);
			dump_drm_nouveau_gem_new(data);
			mmt_log_cont_nl();
		}
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_PUSHBUF)
	{
		struct drm_nouveau_gem_pushbuf *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_PUSHBUF%s pre,  channel: %d, nr_buffers: %s%d%s, buffers: 0x%" PRIx64 ", nr_relocs: %s%d%s, relocs: 0x%" PRIx64 ", nr_push: %s%d%s, push: 0x%" PRIx64 ", suffix0: 0x%x, suffix1: 0x%x, vram_available: %" PRIu64 ", gart_available: %" PRIu64 "\n",
					colors->rname, colors->reset, data->channel, colors->num,
					data->nr_buffers, colors->reset, data->buffers, colors->num,
					data->nr_relocs, colors->reset,data->relocs, colors->num,
					data->nr_push, colors->reset, data->push, data->suffix0,
					data->suffix1, data->vram_available, data->gart_available);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_PREP)
	{
		struct drm_nouveau_gem_cpu_prep *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_PREP%s, handle: %s%3d%s, flags: %s0x%0x%s\n",
					colors->rname, colors->reset, colors->num, data->handle,
					colors->reset, colors->eval, data->flags, colors->reset);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_CPU_FINI)
	{
		struct drm_nouveau_gem_cpu_fini *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_CPU_FINI%s, handle: %d\n", colors->rname,
					colors->reset, data->handle);
	}
	else if (id == DRM_NOUVEAU_IOCTL_GEM_INFO)
	{
		struct drm_nouveau_gem_info *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_NOUVEAU_GEM_INFO%s pre,  handle: %s%3d%s\n", colors->rname,
					colors->reset, colors->num, data->handle, colors->reset);
	}
	else if (id == DRM_IOCTL_VERSION64)
	{
		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_VERSION64%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_VERSION32)
	{
		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_VERSION32%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_GET_MAGIC)
	{
		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_GET_MAGIC%s\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_GEM_CLOSE)
	{
		struct drm_gem_close *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_CLOSE%s, handle: %s%3d%s\n", colors->rname,
					colors->reset, colors->num, data->handle, colors->reset);
	}
	else if (id == DRM_IOCTL_GEM_OPEN)
	{
		struct drm_gem_open *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_OPEN%s pre,  name: %s%d%s\n", colors->rname,
					colors->reset, colors->eval, data->name, colors->reset);
	}
	else if (id == DRM_IOCTL_GET_CAP)
	{
		struct drm_get_cap *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data) // -> post
			mmt_log("%sDRM_IOCTL_GET_CAP%s, capability: %llu\n", colors->rname,
					colors->reset, data->capability);
	}
	else if (id == DRM_IOCTL_SET_VERSION)
	{
		struct drm_set_version *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_VERSION%s pre,  di_major: %2d, di_minor: %2d, dd_major: %2d, dd_minor: %2d\n",
					colors->rname, colors->reset, data->drm_di_major,
					data->drm_di_minor, data->drm_dd_major, data->drm_dd_minor);
	}
	else if (id == DRM_IOCTL_MODE_GETRESOURCES)
	{
		struct drm_mode_card_res *data = ioctl_data;

		if (dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_MODE_GETRESOURCES%s pre,  fb_id_ptr: %p, crtc_id_ptr: %p, connector_id_ptr: %p, "
					"encoder_id_ptr: %p, count_fbs: %d, count_crtcs: %d, count_connectors: %d, count_encoders: %d, "
					"min_width: %d, max_width: %4d, min_height: %d, max_height: %4d\n", colors->rname,
					colors->reset,
					(void *)(uintptr_t)data->fb_id_ptr,
					(void *)(uintptr_t)data->crtc_id_ptr,
					(void *)(uintptr_t)data->connector_id_ptr,
					(void *)(uintptr_t)data->encoder_id_ptr,
					data->count_fbs, data->count_crtcs, data->count_connectors,
					data->count_encoders, data->min_width, data->max_width,
					data->min_height, data->max_height);
	}
	else if (id == DRM_IOCTL_SET_MASTER)
	{
		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_SET_MASTER%s pre\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_DROP_MASTER)
	{
		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_DROP_MASTER%s pre\n", colors->rname, colors->reset);
	}
	else if (id == DRM_IOCTL_AUTH_MAGIC)
	{
		struct drm_auth *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_AUTH_MAGIC%s pre,  magic: 0x%x\n", colors->rname, colors->reset, data->magic);
	}
	else if (id == DRM_IOCTL_GEM_FLINK)
	{
		struct drm_gem_flink *data = ioctl_data;

		if (0 && dump_decoded_ioctl_data)
			mmt_log("%sDRM_IOCTL_GEM_FLINK%s pre,  handle: 0x%x, name: 0x%x\n",
					colors->rname, colors->reset, data->handle, data->name);
	}
	else
	{
		mmt_log("%sunknown drm ioctl%s %x\n", colors->err, colors->reset, nr);
		return 1;
	}

	return 0;
}